

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RewindLoopSetWithFollowFirstCont::Exec
          (RewindLoopSetWithFollowFirstCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  LoopSetWithFollowFirstInst *pLVar4;
  LoopInfo *pLVar5;
  undefined4 *puVar6;
  uint8 *puVar7;
  uint uVar8;
  
  Matcher::QueryContinue(matcher,qcTicks);
  pLVar4 = Matcher::LabelToInstPointer<UnifiedRegex::LoopSetWithFollowFirstInst>
                     (matcher,LoopSetWithFollowFirst,*(Label *)&(this->super_Cont).field_0xc);
  pLVar5 = Matcher::LoopIdToLoopInfo
                     (matcher,(pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.loopId);
  if (pLVar5->number <= (pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x129d,"(loopInfo->number > begin->repeats.lower)",
                       "loopInfo->number > begin->repeats.lower");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  this_00 = pLVar5->offsetsOfFollowFirst;
  if (this_00 ==
      (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    if ((pLVar4->super_FollowFirstMixin).followFirst == L'\xffff') {
      uVar3 = pLVar5->number - 1;
      goto LAB_00d499c3;
    }
  }
  else if ((this_00->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
           count != 0) {
    uVar3 = JsUtil::
            List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::RemoveAtEnd(this_00);
    goto LAB_00d499c3;
  }
  uVar3 = (pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower;
LAB_00d499c3:
  pLVar5->number = uVar3;
  uVar8 = (pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower;
  if (uVar8 < uVar3) {
    uVar8 = uVar3;
  }
  pLVar5->number = uVar8;
  *inputOffset = uVar8 + pLVar5->startInputOffset;
  if ((pLVar4->super_LoopSetInst).super_BeginLoopBasicsMixin.repeats.lower < pLVar5->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopSetWithFollowFirstCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  puVar7 = Matcher::LabelToInstPointer(matcher,*(int *)&(this->super_Cont).field_0xc + 0x38);
  *instPointer = puVar7;
  return true;
}

Assistant:

inline bool RewindLoopSetWithFollowFirstCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        LoopSetWithFollowFirstInst* begin = matcher.L2I(LoopSetWithFollowFirst, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // loopInfo->number is the number of iterations completed before trying follow
        Assert(loopInfo->number > begin->repeats.lower);
        // Try follow with fewer iterations

        if (loopInfo->offsetsOfFollowFirst == nullptr)
        {
            if (begin->followFirst != MaxUChar)
            {
                // We determined the first character in the follow set at compile time,
                // but didn't find a single match for it in the last iteration of the loop.
                // So, there is no benefit in backtracking.
                loopInfo->number = begin->repeats.lower; // stop backtracking
            }
            else
            {
                // We couldn't determine the first character in the follow set at compile time;
                // fall back to backtracking by one character at a time.
                loopInfo->number--;
            }
        }
        else
        {
            if (loopInfo->offsetsOfFollowFirst->Empty())
            {
                // We have already backtracked to the first offset where we matched the LoopSet's followFirst;
                // no point in backtracking more.
                loopInfo->number = begin->repeats.lower; // stop backtracking
            }
            else
            {
                // Backtrack to the previous offset where we matched the LoopSet's followFirst
                // We will be doing one unnecessary match. But, if we wanted to avoid it, we'd have
                // to propagate to the next Inst, that the first character is already matched.
                // Seems like an overkill to avoid one match.
                loopInfo->number = loopInfo->offsetsOfFollowFirst->RemoveAtEnd();
            }
        }

        // If loopInfo->number now is less than begins->repeats.lower, the loop
        // shouldn't match anything. In that case, stop backtracking.
        loopInfo->number = max(loopInfo->number, begin->repeats.lower);
        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number;

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopSetWithFollowFirstCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(LoopSetWithFollowFirstInst));
        return true; // STOP BACKTRACKING
    }